

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O2

LY_ERR ly_path_parse(ly_ctx *ctx,lysc_node *ctx_node,char *str_path,size_t path_len,ly_bool lref,
                    uint16_t begin,uint16_t prefix,uint16_t pred,lyxp_expr **expr)

{
  uint uVar1;
  char *pcVar2;
  lyxp_expr *plVar3;
  ushort uVar4;
  uint16_t uVar5;
  LY_ERR LVar6;
  LY_ERR LVar7;
  int iVar8;
  lyxp_expr_type **pplVar9;
  char *pcVar10;
  undefined8 uVar11;
  ulong uVar12;
  char *s;
  ulong uVar13;
  uint32_t tok_idx;
  lyxp_expr *exp;
  char *local_58;
  lysc_node *local_50;
  uint local_44;
  lyxp_expr *local_40;
  ulong local_38;
  
  exp = (lyxp_expr *)0x0;
  if (1 < (ushort)(begin - 1)) {
    __assert_fail("(begin == LY_PATH_BEGIN_ABSOLUTE) || (begin == LY_PATH_BEGIN_EITHER)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/path.c",
                  0x14d,
                  "LY_ERR ly_path_parse(const struct ly_ctx *, const struct lysc_node *, const char *, size_t, ly_bool, uint16_t, uint16_t, uint16_t, struct lyxp_expr **)"
                 );
  }
  uVar4 = prefix << 0xc | (ushort)(prefix - 0x10) >> 4;
  if ((7 < uVar4) || ((0x8bU >> (uVar4 & 0x1f) & 1) == 0)) {
    __assert_fail("(prefix == LY_PATH_PREFIX_OPTIONAL) || (prefix == LY_PATH_PREFIX_MANDATORY) || (prefix == LY_PATH_PREFIX_FIRST) || (prefix == LY_PATH_PREFIX_STRICT_INHERIT)"
                  ,"/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/path.c",
                  0x14f,
                  "LY_ERR ly_path_parse(const struct ly_ctx *, const struct lysc_node *, const char *, size_t, ly_bool, uint16_t, uint16_t, uint16_t, struct lyxp_expr **)"
                 );
  }
  local_44 = (uint)pred;
  if (((pred != 0x100) && (local_44 != 0x200)) && (local_44 != 0x400)) {
    __assert_fail("(pred == LY_PATH_PRED_KEYS) || (pred == LY_PATH_PRED_SIMPLE) || (pred == LY_PATH_PRED_LEAFREF)"
                  ,"/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/path.c",
                  0x150,
                  "LY_ERR ly_path_parse(const struct ly_ctx *, const struct lysc_node *, const char *, size_t, ly_bool, uint16_t, uint16_t, uint16_t, struct lyxp_expr **)"
                 );
  }
  if (ctx_node != (lysc_node *)0x0) {
    ly_log_location(ctx_node,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
  }
  LVar6 = lyxp_expr_parse(ctx,str_path,path_len,'\0',&exp);
  plVar3 = exp;
  if (LVar6 == LY_SUCCESS) {
    tok_idx = 0;
    pplVar9 = (lyxp_expr_type **)calloc((ulong)exp->size,8);
    plVar3->repeat = pplVar9;
    if (pplVar9 == (lyxp_expr_type **)0x0) {
      LVar6 = LY_EMEM;
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_path_parse");
    }
    else {
      LVar6 = LY_EVALID;
      uVar11 = 0;
      if (begin == 2) {
        LVar6 = lyxp_next_token((ly_ctx *)0x0,plVar3,&tok_idx,LYXP_TOKEN_OPER_PATH);
        if (LVar6 == LY_SUCCESS) {
LAB_00112c54:
          local_38 = CONCAT71((int7)((ulong)uVar11 >> 8),1);
        }
        else {
          if (lref != '\0') {
            uVar5 = ly_ctx_get_options(ctx);
            if (((uVar5 >> 9 & 1) == 0) ||
               (LVar6 = lyxp_check_token((ly_ctx *)0x0,exp,tok_idx,LYXP_TOKEN_FUNCNAME),
               plVar3 = exp, LVar6 != LY_SUCCESS)) {
LAB_00112bc0:
              LVar6 = LY_EVALID;
              LVar7 = lyxp_next_token(ctx,exp,&tok_idx,LYXP_TOKEN_DDOT);
              if (LVar7 == LY_SUCCESS) {
                do {
                  LVar6 = lyxp_next_token(ctx,exp,&tok_idx,LYXP_TOKEN_OPER_PATH);
                  if (LVar6 != LY_SUCCESS) goto LAB_00112e14;
                  LVar6 = lyxp_next_token((ly_ctx *)0x0,exp,&tok_idx,LYXP_TOKEN_DDOT);
                } while (LVar6 == LY_SUCCESS);
                goto LAB_00112c19;
              }
            }
            else {
              local_40 = (lyxp_expr *)0x0;
              LVar6 = lyxp_next_token(ctx,exp,&tok_idx,LYXP_TOKEN_FUNCNAME);
              if (LVar6 == LY_SUCCESS) {
                uVar12 = (ulong)tok_idx;
                uVar1 = plVar3->tok_pos[uVar12];
                pcVar2 = plVar3->expr;
                iVar8 = strncmp(pcVar2 + uVar1,"deref",5);
                if (iVar8 == 0) {
                  ly_vlog(ctx,(char *)0x0,LYVE_XPATH,
                          "Unexpected XPath function \"%.*s\" in path, expected \"deref(...)\"",
                          (ulong)plVar3->tok_len[uVar12],pcVar2 + uVar1);
                }
                else {
                  LVar6 = lyxp_next_token(ctx,plVar3,&tok_idx,LYXP_TOKEN_PAR1);
                  if (LVar6 == LY_SUCCESS) {
                    uVar13 = (ulong)tok_idx;
                    uVar12 = uVar13;
                    while ((LVar6 = lyxp_check_token((ly_ctx *)0x0,plVar3,(uint32_t)uVar12,
                                                     LYXP_TOKEN_PAR2), LVar6 != LY_SUCCESS &&
                           (tok_idx < plVar3->used))) {
                      LVar6 = lyxp_check_token((ly_ctx *)0x0,plVar3,tok_idx,LYXP_TOKEN_FUNCNAME);
                      if (LVar6 == LY_SUCCESS) {
                        ly_vlog(ctx,(char *)0x0,LYVE_XPATH,
                                "Embedded function XPath function inside deref function within the pathis not allowed"
                               );
                        goto LAB_00112e53;
                      }
                      tok_idx = tok_idx + 1;
                      uVar12 = (ulong)tok_idx;
                    }
                    LVar7 = lyxp_next_token(ctx,plVar3,&tok_idx,LYXP_TOKEN_PAR2);
                    LVar6 = LY_EVALID;
                    if ((LVar7 == LY_SUCCESS) &&
                       (uVar1 = plVar3->tok_pos[uVar13],
                       LVar7 = ly_path_parse(ctx,ctx_node,plVar3->expr + uVar1,
                                             (ulong)(plVar3->tok_pos[tok_idx - 1] - uVar1),'\x01',2,
                                             0x10,0x400,&local_40), LVar7 == LY_SUCCESS)) {
                      lyxp_expr_free(ctx,local_40);
                      LVar7 = lyxp_next_token(ctx,exp,&tok_idx,LYXP_TOKEN_OPER_PATH);
                      if (LVar7 != LY_SUCCESS) goto LAB_00112b12;
                      goto LAB_00112bc0;
                    }
                  }
                }
              }
LAB_00112e53:
              LVar6 = LY_EVALID;
            }
            goto LAB_00112b12;
          }
LAB_00112c19:
          local_38 = 0;
        }
        local_58 = (char *)0x0;
        local_38 = local_38 ^ 1;
        local_50 = ctx_node;
        do {
          LVar6 = lyxp_check_token(ctx,exp,tok_idx,LYXP_TOKEN_NAMETEST);
          if (LVar6 != LY_SUCCESS) goto LAB_00112e14;
          s = exp->expr + exp->tok_pos[tok_idx];
          uVar12 = (ulong)exp->tok_len[tok_idx];
          pcVar2 = local_58;
          if ((prefix == 0x80) || (prefix == 0x40)) {
            if (local_58 == (char *)0x0 && (char)local_38 == '\0') {
              pcVar10 = strnstr(s,":",uVar12);
              pcVar2 = s;
              goto joined_r0x00112d12;
            }
            if (((prefix == 0x80) && (local_58 != (char *)0x0)) &&
               (pcVar10 = strnstr(s,":",uVar12), ctx_node = local_50, pcVar2 = local_58,
               pcVar10 != (char *)0x0)) {
              iVar8 = strncmp(local_58,s,(long)pcVar10 - (long)s);
              ctx_node = local_50;
              pcVar2 = s;
              if ((iVar8 == 0) && (local_58[(long)pcVar10 - (long)s] == ':')) {
                ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Duplicate prefix for \"%.*s\" in path.",uVar12,s
                       );
                ctx_node = local_50;
                goto LAB_00112e14;
              }
            }
          }
          else if (prefix == 0x20) {
            pcVar10 = strnstr(s,":",uVar12);
            pcVar2 = local_58;
joined_r0x00112d12:
            if (pcVar10 == (char *)0x0) {
              ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Prefix missing for \"%.*s\" in path.",uVar12,s);
              goto LAB_00112e14;
            }
          }
          local_58 = pcVar2;
          tok_idx = tok_idx + 1;
          LVar6 = ly_path_check_predicate(ctx,ctx_node,exp,&tok_idx,prefix,(uint16_t)local_44);
          if (LVar6 != LY_SUCCESS) goto LAB_00112b12;
          LVar6 = lyxp_next_token((ly_ctx *)0x0,exp,&tok_idx,LYXP_TOKEN_OPER_PATH);
        } while (LVar6 == LY_SUCCESS);
        LVar6 = LY_EVALID;
        if (exp->used <= tok_idx) {
          *expr = exp;
          LVar6 = LY_SUCCESS;
          goto LAB_00112b1f;
        }
        ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Unparsed characters \"%s\" left at the end of path.",
                exp->expr + exp->tok_pos[tok_idx]);
      }
      else {
        LVar7 = lyxp_next_token(ctx,plVar3,&tok_idx,LYXP_TOKEN_OPER_PATH);
        if (LVar7 == LY_SUCCESS) goto LAB_00112c54;
      }
    }
  }
LAB_00112b12:
  lyxp_expr_free(ctx,exp);
LAB_00112b1f:
  ly_log_location_revert((uint)(ctx_node != (lysc_node *)0x0),0,0,0);
  return LVar6;
LAB_00112e14:
  LVar6 = LY_EVALID;
  goto LAB_00112b12;
}

Assistant:

LY_ERR
ly_path_parse(const struct ly_ctx *ctx, const struct lysc_node *ctx_node, const char *str_path, size_t path_len,
        ly_bool lref, uint16_t begin, uint16_t prefix, uint16_t pred, struct lyxp_expr **expr)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyxp_expr *exp = NULL;
    uint32_t tok_idx, cur_len;
    const char *cur_node, *prev_prefix = NULL, *ptr;
    ly_bool is_abs;

    assert((begin == LY_PATH_BEGIN_ABSOLUTE) || (begin == LY_PATH_BEGIN_EITHER));
    assert((prefix == LY_PATH_PREFIX_OPTIONAL) || (prefix == LY_PATH_PREFIX_MANDATORY) ||
            (prefix == LY_PATH_PREFIX_FIRST) || (prefix == LY_PATH_PREFIX_STRICT_INHERIT));
    assert((pred == LY_PATH_PRED_KEYS) || (pred == LY_PATH_PRED_SIMPLE) || (pred == LY_PATH_PRED_LEAFREF));

    if (ctx_node) {
        LOG_LOCSET(ctx_node, NULL);
    }

    /* parse as a generic XPath expression, reparse is performed manually */
    LY_CHECK_GOTO(ret = lyxp_expr_parse(ctx, str_path, path_len, 0, &exp), error);
    tok_idx = 0;

    /* alloc empty repeat (only '=', filled manually) */
    exp->repeat = calloc(exp->size, sizeof *exp->repeat);
    LY_CHECK_ERR_GOTO(!exp->repeat, LOGMEM(ctx); ret = LY_EMEM, error);

    if (begin == LY_PATH_BEGIN_EITHER) {
        /* is the path relative? */
        if (lyxp_next_token(NULL, exp, &tok_idx, LYXP_TOKEN_OPER_PATH)) {
            /* relative path check specific to leafref */
            if (lref) {
                /* optional function 'deref..' */
                if ((ly_ctx_get_options(ctx) & LY_CTX_LEAFREF_EXTENDED) &&
                        !lyxp_check_token(NULL, exp, tok_idx, LYXP_TOKEN_FUNCNAME)) {
                    LY_CHECK_ERR_GOTO(ly_path_parse_deref(ctx, ctx_node, exp, &tok_idx), ret = LY_EVALID, error);

                    /* '/' */
                    LY_CHECK_ERR_GOTO(lyxp_next_token(ctx, exp, &tok_idx, LYXP_TOKEN_OPER_PATH), ret = LY_EVALID,
                            error);
                }

                /* mandatory '..' */
                LY_CHECK_ERR_GOTO(lyxp_next_token(ctx, exp, &tok_idx, LYXP_TOKEN_DDOT), ret = LY_EVALID, error);

                do {
                    /* '/' */
                    LY_CHECK_ERR_GOTO(lyxp_next_token(ctx, exp, &tok_idx, LYXP_TOKEN_OPER_PATH), ret = LY_EVALID,
                            error);

                    /* optional '..' */
                } while (!lyxp_next_token(NULL, exp, &tok_idx, LYXP_TOKEN_DDOT));
            }

            is_abs = 0;
        } else {
            is_abs = 1;
        }
    } else {
        /* '/' */
        LY_CHECK_ERR_GOTO(lyxp_next_token(ctx, exp, &tok_idx, LYXP_TOKEN_OPER_PATH), ret = LY_EVALID, error);

        is_abs = 1;
    }

    do {
        /* NameTest */
        LY_CHECK_ERR_GOTO(lyxp_check_token(ctx, exp, tok_idx, LYXP_TOKEN_NAMETEST), ret = LY_EVALID, error);

        /* check prefix based on the options */
        cur_node = exp->expr + exp->tok_pos[tok_idx];
        cur_len = exp->tok_len[tok_idx];
        if (prefix == LY_PATH_PREFIX_MANDATORY) {
            if (!strnstr(cur_node, ":", cur_len)) {
                LOGVAL(ctx, LYVE_XPATH, "Prefix missing for \"%.*s\" in path.", (int)cur_len, cur_node);
                ret = LY_EVALID;
                goto error;
            }
        } else if ((prefix == LY_PATH_PREFIX_FIRST) || (prefix == LY_PATH_PREFIX_STRICT_INHERIT)) {
            if (!prev_prefix && is_abs) {
                /* the first node must have a prefix */
                if (!strnstr(cur_node, ":", cur_len)) {
                    LOGVAL(ctx, LYVE_XPATH, "Prefix missing for \"%.*s\" in path.", (int)cur_len, cur_node);
                    ret = LY_EVALID;
                    goto error;
                }

                /* remember the first prefix */
                prev_prefix = cur_node;
            } else if (prev_prefix && (prefix == LY_PATH_PREFIX_STRICT_INHERIT)) {
                /* the prefix must be different, if any */
                ptr = strnstr(cur_node, ":", cur_len);
                if (ptr) {
                    if (!strncmp(prev_prefix, cur_node, ptr - cur_node) && (prev_prefix[ptr - cur_node] == ':')) {
                        LOGVAL(ctx, LYVE_XPATH, "Duplicate prefix for \"%.*s\" in path.", (int)cur_len, cur_node);
                        ret = LY_EVALID;
                        goto error;
                    }

                    /* remember this next prefix */
                    prev_prefix = cur_node;
                }
            }
        }

        ++tok_idx;

        /* Predicate* */
        LY_CHECK_GOTO(ret = ly_path_check_predicate(ctx, ctx_node, exp, &tok_idx, prefix, pred), error);

        /* '/' */
    } while (!lyxp_next_token(NULL, exp, &tok_idx, LYXP_TOKEN_OPER_PATH));

    /* trailing token check */
    if (exp->used > tok_idx) {
        LOGVAL(ctx, LYVE_XPATH, "Unparsed characters \"%s\" left at the end of path.", exp->expr + exp->tok_pos[tok_idx]);
        ret = LY_EVALID;
        goto error;
    }

    *expr = exp;

    LOG_LOCBACK(ctx_node ? 1 : 0, 0);
    return LY_SUCCESS;

error:
    lyxp_expr_free(ctx, exp);
    LOG_LOCBACK(ctx_node ? 1 : 0, 0);
    return ret;
}